

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O1

void Aig_ManSetPhase(Aig_Man_t *pAig)

{
  undefined1 *puVar1;
  ulong *puVar2;
  void *pvVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  
  puVar1 = &pAig->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 8;
  pVVar5 = pAig->vCis;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      puVar2 = (ulong *)((long)pVVar5->pArray[lVar4] + 0x18);
      *puVar2 = *puVar2 & 0xfffffffffffffff7;
      lVar4 = lVar4 + 1;
      pVVar5 = pAig->vCis;
    } while (lVar4 < pVVar5->nSize);
  }
  pVVar5 = pAig->vObjs;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      pvVar3 = pVVar5->pArray[lVar4];
      if ((pvVar3 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar3 + 0x18) & 7) - 7))
      {
        *(ulong *)((long)pvVar3 + 0x18) =
             (*(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffff7) +
             (ulong)(((uint)*(ulong *)((long)pvVar3 + 0x10) ^
                     *(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 3)
                     & ((uint)*(ulong *)((long)pvVar3 + 8) ^
                       *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18) >> 3) &
                    1) * 8;
      }
      lVar4 = lVar4 + 1;
      pVVar5 = pAig->vObjs;
    } while (lVar4 < pVVar5->nSize);
  }
  pVVar5 = pAig->vCos;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      pvVar3 = pVVar5->pArray[lVar4];
      *(ulong *)((long)pvVar3 + 0x18) =
           *(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffff7 |
           (ulong)(((int)*(ulong *)((long)pvVar3 + 8) << 3 ^
                   *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18)) & 8);
      lVar4 = lVar4 + 1;
      pVVar5 = pAig->vCos;
    } while (lVar4 < pVVar5->nSize);
  }
  return;
}

Assistant:

static inline Aig_Obj_t *  Aig_ManConst1( Aig_Man_t * p )         { return p->pConst1;                               }